

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O0

int x509_crt_find_parent
              (mbedtls_x509_crt *child,mbedtls_x509_crt *trust_ca,mbedtls_x509_crt **parent,
              int *parent_is_trusted,int *signature_is_good,uint path_cnt,uint self_cnt,
              mbedtls_x509_crt_restart_ctx *rs_ctx,mbedtls_x509_time *now)

{
  mbedtls_x509_crt *local_48;
  mbedtls_x509_crt *search_list;
  int ret;
  uint path_cnt_local;
  int *signature_is_good_local;
  int *parent_is_trusted_local;
  mbedtls_x509_crt **parent_local;
  mbedtls_x509_crt *trust_ca_local;
  mbedtls_x509_crt *child_local;
  
  *parent_is_trusted = 1;
  while( true ) {
    local_48 = trust_ca;
    if (*parent_is_trusted == 0) {
      local_48 = child->next;
    }
    x509_crt_find_parent_in
              (child,local_48,parent,signature_is_good,*parent_is_trusted,path_cnt,self_cnt,rs_ctx,
               now);
    if ((*parent != (mbedtls_x509_crt *)0x0) || (*parent_is_trusted == 0)) break;
    *parent_is_trusted = 0;
  }
  if (*parent == (mbedtls_x509_crt *)0x0) {
    *parent_is_trusted = 0;
    *signature_is_good = 0;
  }
  return 0;
}

Assistant:

static int x509_crt_find_parent(
    mbedtls_x509_crt *child,
    mbedtls_x509_crt *trust_ca,
    mbedtls_x509_crt **parent,
    int *parent_is_trusted,
    int *signature_is_good,
    unsigned path_cnt,
    unsigned self_cnt,
    mbedtls_x509_crt_restart_ctx *rs_ctx,
    const mbedtls_x509_time *now)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_x509_crt *search_list;

    *parent_is_trusted = 1;

#if defined(MBEDTLS_ECDSA_C) && defined(MBEDTLS_ECP_RESTARTABLE)
    /* restore then clear saved state if we have some stored */
    if (rs_ctx != NULL && rs_ctx->parent_is_trusted != -1) {
        *parent_is_trusted = rs_ctx->parent_is_trusted;
        rs_ctx->parent_is_trusted = -1;
    }
#endif

    while (1) {
        search_list = *parent_is_trusted ? trust_ca : child->next;

        ret = x509_crt_find_parent_in(child, search_list,
                                      parent, signature_is_good,
                                      *parent_is_trusted,
                                      path_cnt, self_cnt, rs_ctx, now);

#if defined(MBEDTLS_ECDSA_C) && defined(MBEDTLS_ECP_RESTARTABLE)
        if (rs_ctx != NULL && ret == MBEDTLS_ERR_ECP_IN_PROGRESS) {
            /* save state */
            rs_ctx->parent_is_trusted = *parent_is_trusted;
            return ret;
        }
#else
        (void) ret;
#endif

        /* stop here if found or already in second iteration */
        if (*parent != NULL || *parent_is_trusted == 0) {
            break;
        }

        /* prepare second iteration */
        *parent_is_trusted = 0;
    }

    /* extra precaution against mistakes in the caller */
    if (*parent == NULL) {
        *parent_is_trusted = 0;
        *signature_is_good = 0;
    }

    return 0;
}